

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep * sqlite3TriggerSelectStep(sqlite3 *db,Select *pSelect)

{
  TriggerStep *pTriggerStep;
  Select *pSelect_local;
  sqlite3 *db_local;
  
  db_local = (sqlite3 *)sqlite3DbMallocZero(db,0x48);
  if (db_local == (sqlite3 *)0x0) {
    sqlite3SelectDelete(db,pSelect);
    db_local = (sqlite3 *)0x0;
  }
  else {
    *(undefined1 *)&db_local->pVfs = 0x77;
    db_local->pDfltColl = (CollSeq *)pSelect;
    *(undefined1 *)((long)&db_local->pVfs + 1) = 10;
  }
  return (TriggerStep *)db_local;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerSelectStep(sqlite3 *db, Select *pSelect){
  TriggerStep *pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep));
  if( pTriggerStep==0 ) {
    sqlite3SelectDelete(db, pSelect);
    return 0;
  }
  pTriggerStep->op = TK_SELECT;
  pTriggerStep->pSelect = pSelect;
  pTriggerStep->orconf = OE_Default;
  return pTriggerStep;
}